

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileImmutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file)

{
  bool bVar1;
  mapped_type *classname;
  ClassNameResolver *this_00;
  string *__return_storage_ptr___00;
  FileDescriptor *file_local;
  string local_38;
  
  this_00 = (ClassNameResolver *)&file_local;
  file_local = file;
  classname = std::
              map<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->file_immutable_outer_class_names_,(key_type *)this_00);
  if (classname->_M_string_length == 0) {
    if ((*(byte *)(*(long *)(file_local + 0x78) + 0x28) & 2) == 0) {
      __return_storage_ptr___00 = &local_38;
      GetFileDefaultImmutableClassName_abi_cxx11_(__return_storage_ptr___00,this_00,file_local);
      std::__cxx11::string::operator=((string *)classname,(string *)__return_storage_ptr___00);
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      bVar1 = HasConflictingClassName
                        ((ClassNameResolver *)__return_storage_ptr___00,file_local,classname,
                         EXACT_EQUAL);
      if (bVar1) {
        std::__cxx11::string::append((char *)classname);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)classname);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)classname);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetFileImmutableClassName(
    const FileDescriptor* file) {
  std::string& class_name = file_immutable_outer_class_names_[file];
  if (class_name.empty()) {
    if (file->options().has_java_outer_classname()) {
      class_name = file->options().java_outer_classname();
    } else {
      class_name = GetFileDefaultImmutableClassName(file);
      if (HasConflictingClassName(file, class_name,
                                  NameEquality::EXACT_EQUAL)) {
        class_name += kOuterClassNameSuffix;
      }
    }
  }
  return class_name;
}